

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase100::run(TestCase100 *this)

{
  BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:102:36),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:102:36)>
  *__return_storage_ptr__;
  int iVar1;
  uint uVar2;
  TestConstType *t;
  Type *in_RCX;
  Type *in_R8;
  int local_11c [2];
  bool local_111;
  int local_110;
  int iStack_10c;
  bool _kj_shouldLog_9;
  bool local_105;
  int local_104;
  int iStack_100;
  bool _kj_shouldLog_8;
  bool local_fb;
  Type local_fa;
  Type local_f9;
  bool _kj_shouldLog_7;
  ConstFunction<int_(int,_int)> local_f0;
  int local_e0 [2];
  bool local_d5;
  int local_d4;
  int iStack_d0;
  bool _kj_shouldLog_6;
  bool local_c9;
  int local_c8;
  int iStack_c4;
  bool _kj_shouldLog_5;
  bool local_bf;
  Type local_be;
  Type local_bd;
  TestConstType local_bc;
  bool _kj_shouldLog_4;
  ConstFunction<int_(int,_int)> local_b0;
  int local_9c;
  bool local_95;
  uint local_94;
  uint uStack_90;
  bool _kj_shouldLog_3;
  bool local_89;
  int local_88;
  int iStack_84;
  bool _kj_shouldLog_2;
  bool local_7d;
  int local_7c;
  int iStack_78;
  bool _kj_shouldLog_1;
  bool local_73;
  undefined1 local_72 [2];
  undefined1 auStack_70 [5];
  bool _kj_shouldLog;
  undefined1 local_60 [8];
  ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> f2;
  undefined1 local_3a [2];
  BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:102:36),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:102:36)>
  local_38;
  undefined1 local_28 [8];
  ConstFunction<int_(int,_int)> f;
  TestConstType obj;
  TestCase100 *this_local;
  
  __return_storage_ptr__ =
       (BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:102:36),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:102:36)>
        *)((long)&f.impl.ptr + 4);
  TestConstType::TestConstType((TestConstType *)__return_storage_ptr__,0);
  local_38.t = (TestConstType *)
               _::
               boundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__0,kj::(anonymous_namespace)::TestCase100::run()::__1>
                         (__return_storage_ptr__,(_ *)(local_3a + 1),(TestConstType *)local_3a,
                          (Type *)in_RCX,(Type *)in_R8);
  ConstFunction<int(int,int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__0,kj::(anonymous_namespace)::TestCase100::run()::__1>>
            ((ConstFunction<int(int,int)> *)local_28,&local_38);
  _auStack_70 = _::
                boundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__2,kj::(anonymous_namespace)::TestCase100::run()::__3>
                          ((BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:103:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:103:40)>
                            *)((long)&f.impl.ptr + 4),(_ *)(local_72 + 1),(TestConstType *)local_72,
                           in_RCX,in_R8);
  ConstFunction<unsigned_int(unsigned_int,unsigned_int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType&,kj::(anonymous_namespace)::TestCase100::run()::__2,kj::(anonymous_namespace)::TestCase100::run()::__3>>
            ((ConstFunction<unsigned_int(unsigned_int,unsigned_int)> *)local_60,
             (BoundMethod<kj::(anonymous_namespace)::TestConstType_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:103:40),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:103:40)>
              *)auStack_70);
  iVar1 = ConstFunction<int_(int,_int)>::operator()
                    ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
  if (iVar1 != 0x243) {
    local_73 = _::Debug::shouldLog(ERROR);
    while (local_73 != false) {
      iStack_78 = 0x243;
      local_7c = ConstFunction<int_(int,_int)>::operator()
                           ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
      _::Debug::log<char_const(&)[46],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x69,ERROR,
                 "\"failed: expected \" \"(123 + 456) == (f(123, 456))\", 123 + 456, f(123, 456)",
                 (char (*) [46])"failed: expected (123 + 456) == (f(123, 456))",
                 &stack0xffffffffffffff88,&local_7c);
      local_73 = false;
    }
  }
  iVar1 = ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,7,8);
  if (iVar1 != 0x10) {
    local_7d = _::Debug::shouldLog(ERROR);
    while (local_7d != false) {
      iStack_84 = 0x10;
      local_88 = ConstFunction<int_(int,_int)>::operator()
                           ((ConstFunction<int_(int,_int)> *)local_28,7,8);
      _::Debug::log<char_const(&)[42],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x6a,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 1) == (f(7, 8))\", 7 + 8 + 1, f(7, 8)",
                 (char (*) [42])"failed: expected (7 + 8 + 1) == (f(7, 8))",&stack0xffffffffffffff7c
                 ,&local_88);
      local_7d = false;
    }
  }
  uVar2 = ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::operator()
                    ((ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> *)local_60,2,9);
  if (uVar2 != 0xd) {
    local_89 = _::Debug::shouldLog(ERROR);
    while (local_89 != false) {
      uStack_90 = 0xd;
      local_94 = ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::operator()
                           ((ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> *)local_60,2,9
                           );
      _::Debug::log<char_const(&)[46],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"(9u + 2u + 2u) == (f2(2, 9))\", 9u + 2u + 2u, f2(2, 9)",
                 (char (*) [46])"failed: expected (9u + 2u + 2u) == (f2(2, 9))",
                 &stack0xffffffffffffff70,&local_94);
      local_89 = false;
    }
  }
  if (f.impl.ptr._4_4_ != 3) {
    local_95 = _::Debug::shouldLog(ERROR);
    while (local_95 != false) {
      local_9c = 3;
      _::Debug::log<char_const(&)[40],int,int&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x6d,ERROR,"\"failed: expected \" \"(3) == (obj.callCount)\", 3, obj.callCount",
                 (char (*) [40])"failed: expected (3) == (obj.callCount)",&local_9c,
                 (int *)((long)&f.impl.ptr + 4));
      local_95 = false;
    }
  }
  TestConstType::TestConstType(&local_bc,10);
  _::
  boundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__4,kj::(anonymous_namespace)::TestCase100::run()::__5>
            ((_ *)&stack0xffffffffffffff48,&local_bc,&local_bd,&local_be);
  ConstFunction<int(int,int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__4,kj::(anonymous_namespace)::TestCase100::run()::__5>>
            ((ConstFunction<int(int,int)> *)&local_b0,
             (BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:112:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:112:7)>
              *)&stack0xffffffffffffff48);
  ConstFunction<int_(int,_int)>::operator=((ConstFunction<int_(int,_int)> *)local_28,&local_b0);
  ConstFunction<int_(int,_int)>::~ConstFunction(&local_b0);
  _::
  BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++:112:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++:112:7)>
  ::~BoundMethod((BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:112:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:112:7)>
                  *)&stack0xffffffffffffff48);
  TestConstType::~TestConstType(&local_bc);
  iVar1 = ConstFunction<int_(int,_int)>::operator()
                    ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
  if (iVar1 != 0x24d) {
    local_bf = _::Debug::shouldLog(ERROR);
    while (local_bf != false) {
      iStack_c4 = 0x24d;
      local_c8 = ConstFunction<int_(int,_int)>::operator()
                           ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
      _::Debug::log<char_const(&)[51],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x72,ERROR,
                 "\"failed: expected \" \"(123 + 456 + 10) == (f(123, 456))\", 123 + 456 + 10, f(123, 456)"
                 ,(char (*) [51])"failed: expected (123 + 456 + 10) == (f(123, 456))",
                 &stack0xffffffffffffff3c,&local_c8);
      local_bf = false;
    }
  }
  iVar1 = ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,7,8);
  if (iVar1 != 0x1a) {
    local_c9 = _::Debug::shouldLog(ERROR);
    while (local_c9 != false) {
      iStack_d0 = 0x1a;
      local_d4 = ConstFunction<int_(int,_int)>::operator()
                           ((ConstFunction<int_(int,_int)> *)local_28,7,8);
      _::Debug::log<char_const(&)[43],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x73,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 11) == (f(7, 8))\", 7 + 8 + 11, f(7, 8)",
                 (char (*) [43])"failed: expected (7 + 8 + 11) == (f(7, 8))",
                 &stack0xffffffffffffff30,&local_d4);
      local_c9 = false;
    }
  }
  iVar1 = ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,2,9);
  if (iVar1 != 0x17) {
    local_d5 = _::Debug::shouldLog(ERROR);
    while (local_d5 != false) {
      local_e0[1] = 0x17;
      local_e0[0] = ConstFunction<int_(int,_int)>::operator()
                              ((ConstFunction<int_(int,_int)> *)local_28,2,9);
      _::Debug::log<char_const(&)[43],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x74,ERROR,
                 "\"failed: expected \" \"(9 + 2 + 12) == (f(2, 9))\", 9 + 2 + 12, f(2, 9)",
                 (char (*) [43])"failed: expected (9 + 2 + 12) == (f(2, 9))",local_e0 + 1,local_e0);
      local_d5 = false;
    }
  }
  t = mv<kj::(anonymous_namespace)::TestConstType>((TestConstType *)((long)&f.impl.ptr + 4));
  _::
  boundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__6,kj::(anonymous_namespace)::TestCase100::run()::__7>
            ((_ *)&stack0xffffffffffffff08,t,&local_f9,&local_fa);
  ConstFunction<int(int,int)>::
  ConstFunction<kj::_::BoundMethod<kj::(anonymous_namespace)::TestConstType,kj::(anonymous_namespace)::TestCase100::run()::__6,kj::(anonymous_namespace)::TestCase100::run()::__7>>
            ((ConstFunction<int(int,int)> *)&local_f0,
             (BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:119:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:119:7)>
              *)&stack0xffffffffffffff08);
  ConstFunction<int_(int,_int)>::operator=((ConstFunction<int_(int,_int)> *)local_28,&local_f0);
  ConstFunction<int_(int,_int)>::~ConstFunction(&local_f0);
  _::
  BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++:119:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++:119:7)>
  ::~BoundMethod((BoundMethod<kj::(anonymous_namespace)::TestConstType,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:119:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_function_test_c__:119:7)>
                  *)&stack0xffffffffffffff08);
  f.impl.ptr._4_4_ = 0x4d2;
  iVar1 = ConstFunction<int_(int,_int)>::operator()
                    ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
  if (iVar1 != 0x246) {
    local_fb = _::Debug::shouldLog(ERROR);
    while (local_fb != false) {
      iStack_100 = 0x246;
      local_104 = ConstFunction<int_(int,_int)>::operator()
                            ((ConstFunction<int_(int,_int)> *)local_28,0x7b,0x1c8);
      _::Debug::log<char_const(&)[50],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x7a,ERROR,
                 "\"failed: expected \" \"(123 + 456 + 3) == (f(123, 456))\", 123 + 456 + 3, f(123, 456)"
                 ,(char (*) [50])"failed: expected (123 + 456 + 3) == (f(123, 456))",
                 &stack0xffffffffffffff00,&local_104);
      local_fb = false;
    }
  }
  iVar1 = ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,7,8);
  if (iVar1 != 0x13) {
    local_105 = _::Debug::shouldLog(ERROR);
    while (local_105 != false) {
      iStack_10c = 0x13;
      local_110 = ConstFunction<int_(int,_int)>::operator()
                            ((ConstFunction<int_(int,_int)> *)local_28,7,8);
      _::Debug::log<char_const(&)[42],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x7b,ERROR,
                 "\"failed: expected \" \"(7 + 8 + 4) == (f(7, 8))\", 7 + 8 + 4, f(7, 8)",
                 (char (*) [42])"failed: expected (7 + 8 + 4) == (f(7, 8))",&stack0xfffffffffffffef4
                 ,&local_110);
      local_105 = false;
    }
  }
  iVar1 = ConstFunction<int_(int,_int)>::operator()((ConstFunction<int_(int,_int)> *)local_28,2,9);
  if (iVar1 != 0x10) {
    local_111 = _::Debug::shouldLog(ERROR);
    while (local_111 != false) {
      local_11c[1] = 0x10;
      local_11c[0] = ConstFunction<int_(int,_int)>::operator()
                               ((ConstFunction<int_(int,_int)> *)local_28,2,9);
      _::Debug::log<char_const(&)[42],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/function-test.c++"
                 ,0x7c,ERROR,
                 "\"failed: expected \" \"(9 + 2 + 5) == (f(2, 9))\", 9 + 2 + 5, f(2, 9)",
                 (char (*) [42])"failed: expected (9 + 2 + 5) == (f(2, 9))",local_11c + 1,local_11c)
      ;
      local_111 = false;
    }
  }
  ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)>::~ConstFunction
            ((ConstFunction<unsigned_int_(unsigned_int,_unsigned_int)> *)local_60);
  ConstFunction<int_(int,_int)>::~ConstFunction((ConstFunction<int_(int,_int)> *)local_28);
  TestConstType::~TestConstType((TestConstType *)((long)&f.impl.ptr + 4));
  return;
}

Assistant:

TEST(ConstFunction, Method) {
  TestConstType obj;
  ConstFunction<int(int, int)> f = KJ_BIND_METHOD(obj, foo);
  ConstFunction<uint(uint, uint)> f2 = KJ_BIND_METHOD(obj, foo);

  EXPECT_EQ(123 + 456, f(123, 456));
  EXPECT_EQ(7 + 8 + 1, f(7, 8));
  EXPECT_EQ(9u + 2u + 2u, f2(2, 9));

  EXPECT_EQ(3, obj.callCount);

  // Bind to a temporary.
  f = KJ_BIND_METHOD(TestConstType(10), foo);

  EXPECT_EQ(123 + 456 + 10, f(123, 456));
  EXPECT_EQ(7 + 8 + 11, f(7, 8));
  EXPECT_EQ(9 + 2 + 12, f(2, 9));

  // Bind to a move.
  f = KJ_BIND_METHOD(kj::mv(obj), foo);
  obj.callCount = 1234;

  EXPECT_EQ(123 + 456 + 3, f(123, 456));
  EXPECT_EQ(7 + 8 + 4, f(7, 8));
  EXPECT_EQ(9 + 2 + 5, f(2, 9));
}